

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O1

Bytes __thiscall Omega_h::lor_each(Omega_h *this,Bytes *a,Bytes *b)

{
  int *piVar1;
  Alloc *pAVar2;
  Alloc *pAVar3;
  int iVar4;
  int iVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar6;
  long lVar7;
  LO size_in;
  bool bVar8;
  Bytes BVar9;
  Write<signed_char> c;
  type f;
  Write<signed_char> local_d8;
  Write<signed_char> local_c8;
  undefined1 local_b8 [32];
  Alloc *local_98;
  void *local_90;
  Alloc *local_88;
  void *local_80;
  Alloc *local_78;
  void *local_70;
  Alloc *local_68;
  void *local_60;
  Alloc *local_58;
  void *pvStack_50;
  Alloc *local_48;
  void *pvStack_40;
  Alloc *local_38;
  void *pvStack_30;
  
  pAVar2 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    iVar4 = (int)pAVar2->size;
  }
  else {
    iVar4 = (int)((ulong)pAVar2 >> 3);
  }
  pAVar3 = (b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    iVar5 = (int)pAVar3->size;
  }
  else {
    iVar5 = (int)((ulong)pAVar3 >> 3);
  }
  if (iVar4 == iVar5) {
    if (((ulong)pAVar2 & 1) == 0) {
      size_in = (LO)pAVar2->size;
    }
    else {
      size_in = (LO)((ulong)pAVar2 >> 3);
    }
    local_b8._0_8_ = (Alloc *)(local_b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"");
    Write<signed_char>::Write(&local_d8,size_in,(string *)local_b8);
    if ((Alloc *)local_b8._0_8_ != (Alloc *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
    }
    local_88 = local_d8.shared_alloc_.alloc;
    if (((ulong)local_d8.shared_alloc_.alloc & 7) == 0 &&
        local_d8.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_88 = (Alloc *)((local_d8.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_d8.shared_alloc_.alloc)->use_count = (local_d8.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_80 = local_d8.shared_alloc_.direct_ptr;
    local_78 = (a->write_).shared_alloc_.alloc;
    if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_78 = (Alloc *)(local_78->size * 8 + 1);
      }
      else {
        local_78->use_count = local_78->use_count + 1;
      }
    }
    local_70 = (a->write_).shared_alloc_.direct_ptr;
    local_68 = (b->write_).shared_alloc_.alloc;
    if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68 = (Alloc *)(local_68->size * 8 + 1);
      }
      else {
        local_68->use_count = local_68->use_count + 1;
      }
    }
    local_60 = (b->write_).shared_alloc_.direct_ptr;
    if (((ulong)local_d8.shared_alloc_.alloc & 1) == 0) {
      iVar4 = (int)(local_d8.shared_alloc_.alloc)->size;
    }
    else {
      iVar4 = (int)((ulong)local_d8.shared_alloc_.alloc >> 3);
    }
    local_58 = local_88;
    if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_58 = (Alloc *)(local_88->size * 8 + 1);
      }
      else {
        local_88->use_count = local_88->use_count + 1;
      }
    }
    pvStack_50 = local_d8.shared_alloc_.direct_ptr;
    local_48 = local_78;
    if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_48 = (Alloc *)(local_78->size * 8 + 1);
      }
      else {
        local_78->use_count = local_78->use_count + 1;
      }
    }
    local_38 = local_68;
    if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_38 = (Alloc *)(local_68->size * 8 + 1);
      }
      else {
        local_68->use_count = local_68->use_count + 1;
      }
    }
    pvStack_40 = local_70;
    pvStack_30 = local_60;
    if (0 < iVar4) {
      local_b8._0_8_ = local_58;
      local_b8._8_8_ = local_d8.shared_alloc_.direct_ptr;
      if (((ulong)local_58 & 7) == 0 && local_58 != (Alloc *)0x0) {
        local_58->use_count = local_58->use_count + -1;
        local_b8._0_8_ = local_58->size * 8 + 1;
      }
      local_58 = (Alloc *)0x0;
      pvStack_50 = (void *)0x0;
      local_b8._16_8_ = local_48;
      if (((ulong)local_48 & 7) == 0 && local_48 != (Alloc *)0x0) {
        local_48->use_count = local_48->use_count + -1;
        local_b8._16_8_ = local_48->size * 8 + 1;
      }
      local_48 = (Alloc *)0x0;
      pvStack_40 = (void *)0x0;
      local_98 = local_38;
      if (((ulong)local_38 & 7) == 0 && local_38 != (Alloc *)0x0) {
        local_38->use_count = local_38->use_count + -1;
        local_98 = (Alloc *)(local_38->size * 8 + 1);
      }
      local_38 = (Alloc *)0x0;
      pvStack_30 = (void *)0x0;
      entering_parallel = '\0';
      lVar7 = 0;
      do {
        bVar8 = true;
        if (*(char *)((long)local_70 + lVar7) == '\0') {
          bVar8 = *(char *)((long)local_60 + lVar7) != '\0';
        }
        *(bool *)((long)local_d8.shared_alloc_.direct_ptr + lVar7) = bVar8;
        lVar7 = lVar7 + 1;
      } while (iVar4 != (int)lVar7);
      local_b8._24_8_ = local_70;
      local_90 = local_60;
      lor_each(Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)local_b8);
    }
    lor_each(Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)&local_58);
    local_c8.shared_alloc_.alloc = local_d8.shared_alloc_.alloc;
    local_c8.shared_alloc_.direct_ptr = local_d8.shared_alloc_.direct_ptr;
    if ((((ulong)local_d8.shared_alloc_.alloc & 7) == 0 &&
         local_d8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_d8.shared_alloc_.alloc)->use_count = (local_d8.shared_alloc_.alloc)->use_count + -1;
      local_c8.shared_alloc_.alloc = (Alloc *)((local_d8.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_d8.shared_alloc_.alloc = (Alloc *)0x0;
    local_d8.shared_alloc_.direct_ptr = (void *)0x0;
    Read<signed_char>::Read((Read<signed_char> *)this,&local_c8);
    pAVar2 = local_c8.shared_alloc_.alloc;
    if (((ulong)local_c8.shared_alloc_.alloc & 7) == 0 &&
        local_c8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_c8.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_c8.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    lor_each(Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)&local_88);
    pAVar2 = local_d8.shared_alloc_.alloc;
    pvVar6 = extraout_RDX;
    if (((ulong)local_d8.shared_alloc_.alloc & 7) == 0 &&
        local_d8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_d8.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_d8.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar6 = extraout_RDX_00;
      }
    }
    BVar9.write_.shared_alloc_.direct_ptr = pvVar6;
    BVar9.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Bytes)BVar9.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
       ,0x169);
}

Assistant:

Bytes lor_each(Bytes a, Bytes b) {
  OMEGA_H_CHECK(a.size() == b.size());
  Write<I8> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = (a[i] || b[i]); };
  parallel_for(c.size(), f, "lor_each");
  return c;
}